

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.h
# Opt level: O2

void __thiscall
soplex::SLUFactor<double>::setTolerances
          (SLUFactor<double> *this,shared_ptr<soplex::Tolerances> *tolerances)

{
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_CLUFactor<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->eta)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->forest)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ssvec)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,&_Stack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  return;
}

Assistant:

virtual void setTolerances(std::shared_ptr<Tolerances> tolerances)
   {
      this->_tolerances = tolerances;
      this->eta.setTolerances(tolerances);
      this->forest.setTolerances(tolerances);
      this->ssvec.setTolerances(tolerances);
   }